

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O3

void __thiscall
Lowerer::GenerateLocalLdFldFromFlagInlineCache
          (Lowerer *this,Instr *insertBeforeInstr,RegOpnd *opndBase,Opnd *opndDst,
          RegOpnd *opndInlineCache,LabelInstr *labelFallThru,bool isInlineSlot)

{
  BYTE scale;
  DWORD offset;
  RegOpnd *baseOpnd;
  IndirOpnd *pIVar1;
  RegOpnd *indexOpnd;
  
  baseOpnd = opndBase;
  if (!isInlineSlot) {
    baseOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
    offset = Js::DynamicObject::GetOffsetOfAuxSlots();
    pIVar1 = IR::IndirOpnd::New(opndBase,offset,TyInt64,this->m_func,false);
    InsertMove(&baseOpnd->super_Opnd,&pIVar1->super_Opnd,insertBeforeInstr,false);
  }
  indexOpnd = IR::RegOpnd::New(TyInt64,this->m_func);
  pIVar1 = IR::IndirOpnd::New(opndInlineCache,10,TyUint16,this->m_func,false);
  InsertMove(&indexOpnd->super_Opnd,&pIVar1->super_Opnd,insertBeforeInstr,false);
  scale = LowererMDArch::GetDefaultIndirScale();
  pIVar1 = IR::IndirOpnd::New(baseOpnd,indexOpnd,scale,TyInt64,this->m_func);
  InsertMove(opndDst,&pIVar1->super_Opnd,insertBeforeInstr,false);
  InsertBranch(Br,false,labelFallThru,insertBeforeInstr);
  return;
}

Assistant:

void
Lowerer::GenerateLocalLdFldFromFlagInlineCache(
    IR::Instr * insertBeforeInstr,
    IR::RegOpnd * opndBase,
    IR::Opnd * opndDst,
    IR::RegOpnd * opndInlineCache,
    IR::LabelInstr * labelFallThru,
    bool isInlineSlot)
{
    // Generate:
    //
    // s1 = MOV [&(inlineCache->u.accessor.object)] -- load the cached prototype object
    // s1 = MOV [&s1->slots] -- load the slot array
    // s2 = MOVZXW [&(inlineCache->u.accessor.slotIndex)] -- load the cached slot index
    // dst = MOV [s1 + s2*4]
    //      JMP $fallthru

    IR::IndirOpnd * opndIndir;
    IR::RegOpnd * opndObjSlots = nullptr;

    if (!isInlineSlot)
    {
        // s1 = MOV [&s1->slots] -- load the slot array
        opndObjSlots = IR::RegOpnd::New(TyMachReg, this->m_func);
        opndIndir = IR::IndirOpnd::New(opndBase, Js::DynamicObject::GetOffsetOfAuxSlots(), TyMachReg, this->m_func);
        InsertMove(opndObjSlots, opndIndir, insertBeforeInstr, false);
    }

    // s2 = MOVZXW [&(inlineCache->u.accessor.slotIndex)] -- load the cached slot index
    IR::RegOpnd *opndSlotIndex = IR::RegOpnd::New(TyMachReg, this->m_func);
    IR::Opnd* slotIndexOpnd = IR::IndirOpnd::New(opndInlineCache, (int32)offsetof(Js::InlineCache, u.accessor.slotIndex), TyUint16, this->m_func);
    InsertMove(opndSlotIndex, slotIndexOpnd, insertBeforeInstr, false);

    if (isInlineSlot)
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndBase, opndSlotIndex, m_lowererMD.GetDefaultIndirScale(), TyMachReg, this->m_func);
    }
    else
    {
        // dst = MOV [s1 + s2*4]
        opndIndir = IR::IndirOpnd::New(opndObjSlots, opndSlotIndex, m_lowererMD.GetDefaultIndirScale(), TyMachReg, this->m_func);
    }
    InsertMove(opndDst, opndIndir, insertBeforeInstr, false);

    // JMP $fallthru
    InsertBranch(Js::OpCode::Br, labelFallThru, insertBeforeInstr);
}